

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

void __thiscall HighsLpRelaxation::performAging(HighsLpRelaxation *this,bool deleteRows)

{
  double *pdVar1;
  int iVar2;
  HighsMipSolver *pHVar3;
  pointer pLVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  HighsInt ndelcuts;
  double dVar12;
  vector<int,_std::allocator<int>_> deletemask;
  int local_54;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((((this->lpsolver).info_.super_HighsInfoStruct.basis_validity != 0) &&
      (dVar12 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility,
      pHVar3 = this->mipsolver,
      pdVar1 = &((pHVar3->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol,
      dVar12 < *pdVar1 || dVar12 == *pdVar1)) && ((this->lpsolver).solution_.dual_valid == true)) {
    if (deleteRows) {
      iVar2 = (pHVar3->options_mip_->super_HighsOptionsStruct).mip_lp_age_limit;
      uVar7 = this->epochs + 1;
      this->epochs = uVar7;
      uVar8 = 2;
      if (2 < iVar2 >> 1) {
        uVar8 = (ulong)(uint)(iVar2 >> 1);
      }
      local_54 = 0x7fffffff;
      if ((uVar7 % uVar8 == 0) && (local_54 = (int)uVar7, iVar2 < (int)uVar7)) {
        local_54 = iVar2;
      }
    }
    else {
      local_54 = 0x7fffffff;
      if (this->lastAgeCall == this->numlpiters) {
        return;
      }
    }
    this->lastAgeCall = this->numlpiters;
    iVar2 = (this->lpsolver).model_.lp_.num_row_;
    iVar10 = pHVar3->model_->num_row_;
    lVar9 = (long)iVar10;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ndelcuts = 0;
    if (iVar2 != iVar10) {
      lVar11 = lVar9 * 0xc;
      iVar10 = iVar2 - iVar10;
      ndelcuts = 0;
      do {
        if ((this->lpsolver).basis_.row_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[lVar9] == kBasic) {
          uVar5 = 1;
          if (!deleteRows) {
            uVar5 = (uint)(*(int *)((long)&((this->lprows).
                                            super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->age + lVar11
                                   ) != 0);
          }
          pLVar4 = (this->lprows).
                   super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar6 = uVar5 + *(int *)((long)&pLVar4->age + lVar11);
          *(int *)((long)&pLVar4->age + lVar11) = iVar6;
          if (local_54 < iVar6) {
            if (ndelcuts == 0) {
              std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)iVar2);
            }
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar9] = 1;
            HighsCutPool::lpCutRemoved
                      (&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->cutpool,
                       *(HighsInt *)
                        ((long)&((this->lprows).
                                 super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->index + lVar11));
            ndelcuts = ndelcuts + 1;
          }
        }
        else {
          dVar12 = ABS((this->lpsolver).solution_.row_dual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar9]);
          pdVar1 = &(this->lpsolver).options_.super_HighsOptionsStruct.dual_feasibility_tolerance;
          if (*pdVar1 <= dVar12 && dVar12 != *pdVar1) {
            *(undefined4 *)
             ((long)&((this->lprows).
                      super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                      ._M_impl.super__Vector_impl_data._M_start)->age + lVar11) = 0;
          }
        }
        lVar9 = lVar9 + 1;
        lVar11 = lVar11 + 0xc;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    removeCuts(this,ndelcuts,&local_48);
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsLpRelaxation::performAging(bool deleteRows) {
  assert(lpsolver.getLp().num_row_ ==
         (HighsInt)lpsolver.getLp().row_lower_.size());
  HighsInt agelimit;

  if (lpsolver.getInfo().basis_validity == kBasisValidityInvalid ||
      lpsolver.getInfo().max_dual_infeasibility > mipsolver.mipdata_->feastol ||
      !lpsolver.getSolution().dual_valid)
    return;

  if (deleteRows) {
    agelimit = mipsolver.options_mip_->mip_lp_age_limit;

    ++epochs;
    if (epochs % std::max(agelimit >> 1, HighsInt{2}) != 0)
      agelimit = kHighsIInf;
    else if ((HighsInt)epochs < agelimit)
      agelimit = epochs;
  } else {
    if (lastAgeCall == numlpiters) return;
    agelimit = kHighsIInf;
  }

  lastAgeCall = numlpiters;

  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      lprows[i].age += (deleteRows || lprows[i].age != 0);
      if (lprows[i].age > agelimit) {
        if (ndelcuts == 0) deletemask.resize(nlprows);
        ++ndelcuts;
        deletemask[i] = 1;
        mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
      }
    } else if (std::abs(lpsolver.getSolution().row_dual[i]) >
               lpsolver.getOptions().dual_feasibility_tolerance) {
      lprows[i].age = 0;
    }
  }

  removeCuts(ndelcuts, deletemask);
}